

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp.h
# Opt level: O0

const_iterator __thiscall
GF2::MP<135UL,_GF2::MOLex<135UL>_>::Find(MP<135UL,_GF2::MOLex<135UL>_> *this,MM<135UL> *mRight)

{
  bool bVar1;
  undefined8 in_RSI;
  WW<135UL> *in_RDI;
  const_iterator iter;
  WW<135UL> *in_stack_ffffffffffffffa8;
  bool local_41;
  _Self local_38 [2];
  _List_node_base *local_28;
  _List_node_base *local_20;
  undefined8 local_18;
  _Self local_8;
  
  local_18 = in_RSI;
  local_20 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::begin
                       ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                        in_stack_ffffffffffffffa8);
  local_28 = (_List_node_base *)
             std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                       ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                        in_stack_ffffffffffffffa8);
  local_8._M_node =
       (_List_node_base *)
       std::lower_bound<std::_List_const_iterator<GF2::MM<135ul>>,GF2::MM<135ul>,GF2::MOLex<135ul>>
                 (local_20,local_28,local_18);
  local_38[0]._M_node =
       (_List_node_base *)
       std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                 ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                  in_stack_ffffffffffffffa8);
  bVar1 = std::operator!=(&local_8,local_38);
  local_41 = false;
  if (bVar1) {
    std::_List_const_iterator<GF2::MM<135UL>_>::operator*
              ((_List_const_iterator<GF2::MM<135UL>_> *)in_RDI);
    local_41 = WW<135ul>::operator!=(in_RDI,in_stack_ffffffffffffffa8);
  }
  if (local_41 != false) {
    local_8._M_node =
         (_List_node_base *)
         std::__cxx11::list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_>::end
                   ((list<GF2::MM<135UL>,_std::allocator<GF2::MM<135UL>_>_> *)
                    in_stack_ffffffffffffffa8);
  }
  return (const_iterator)local_8._M_node;
}

Assistant:

const_iterator Find(const MM<_n>& mRight) const
	{	 
		// находим первую позицию в списке, вставка в которую mRight 
		// не нарушит порядок
		const_iterator iter = std::lower_bound(begin(), end(), mRight, _order);
		// нет совпадения?
		if (iter != end() && *iter != mRight)
			iter = end();
		return iter;
	}